

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<false,_true,_false>::delete_sib_(DaTrie<false,_true,_false> *this,uint32_t node_pos)

{
  pointer pBVar1;
  Bc BVar2;
  pointer pNVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  
  uVar4 = (ulong)node_pos;
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) <= uVar4) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x22f,
                  "void ddd::DaTrie<false, true, false>::delete_sib_(uint32_t) [WithBLM = false, WithNLM = true, Prefix = false]"
                 );
  }
  BVar2 = pBVar1[uVar4];
  if ((long)BVar2 < 0) {
    pNVar3 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar5 = &pNVar3->child + (uint)(BVar2._4_4_ * 2);
    puVar6 = puVar5;
    do {
      puVar6 = &pNVar3[(uint)*puVar6 ^
                       (uint)*(undefined8 *)
                              (&pBVar1->field_0x0 + ((ulong)BVar2 >> 0x1d & 0x3fffffff8)) &
                       0x7fffffff].sib;
    } while (*puVar6 !=
             (byte)((byte)node_pos ^
                   (byte)*(undefined8 *)(&pBVar1->field_0x0 + ((ulong)BVar2 >> 0x1d & 0x3fffffff8)))
            );
    if (*puVar5 == *puVar6) {
      *puVar5 = pNVar3[uVar4].sib;
    }
    *puVar6 = pNVar3[uVar4].sib;
    return;
  }
  __assert_fail("bc_[node_pos].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x230,
                "void ddd::DaTrie<false, true, false>::delete_sib_(uint32_t) [WithBLM = false, WithNLM = true, Prefix = false]"
               );
}

Assistant:

void delete_sib_(uint32_t node_pos) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto parent_pos = bc_[node_pos].check();
    auto base = bc_[parent_pos].base();
    auto label = static_cast<uint8_t>(base ^ node_pos);

    auto _node_pos = base ^node_links_[parent_pos].child;
    while (node_links_[_node_pos].sib != label) {
      _node_pos = base ^ node_links_[_node_pos].sib;
    }

    if (node_links_[parent_pos].child == node_links_[_node_pos].sib) {
      node_links_[parent_pos].child = node_links_[node_pos].sib;
    }
    node_links_[_node_pos].sib = node_links_[node_pos].sib;
  }